

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O2

void __thiscall
burst::
subset_iterator<std::_List_iterator<int>,_std::less<void>,_std::vector<std::_List_iterator<int>,_std::allocator<std::_List_iterator<int>_>_>_>
::increment(subset_iterator<std::_List_iterator<int>,_std::less<void>,_std::vector<std::_List_iterator<int>,_std::allocator<std::_List_iterator<int>_>_>_>
            *this)

{
  pointer p_Var1;
  __normal_iterator<std::_List_iterator<int>_*,_std::vector<std::_List_iterator<int>,_std::allocator<std::_List_iterator<int>_>_>_>
  _Var2;
  
  p_Var1 = (this->m_subset).
           super__Vector_base<std::_List_iterator<int>,_std::allocator<std::_List_iterator<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  _Var2 = next_subset<__gnu_cxx::__normal_iterator<std::_List_iterator<int>*,std::vector<std::_List_iterator<int>,std::allocator<std::_List_iterator<int>>>>,std::_List_iterator<int>,std::less<void>>
                    (p_Var1,p_Var1 + this->m_subset_size,(this->m_begin)._M_node,
                     (this->m_end)._M_node);
  this->m_subset_size =
       (long)_Var2._M_current -
       (long)(this->m_subset).
             super__Vector_base<std::_List_iterator<int>,_std::allocator<std::_List_iterator<int>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  return;
}

Assistant:

void increment ()
        {
            const auto new_subset_end =
                next_subset(subset_begin(), subset_end(), m_begin, m_end, m_compare);
            m_subset_size = std::distance(subset_begin(), new_subset_end);
        }